

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O0

void cbc512Decrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *cipher_text,uint64_t num_blocks)

{
  bool bVar1;
  ulong uStack_b0;
  _Bool even;
  uint64_t block;
  uint64_t prev_block_even [8];
  uint64_t prev_block_odd [8];
  uint64_t num_blocks_local;
  uint64_t *cipher_text_local;
  uint64_t *iv_local;
  ThreefishKey_t *key_local;
  
  memset(prev_block_even + 7,0,0x40);
  memset(&block,0,0x40);
  for (uStack_b0 = 0; uStack_b0 < num_blocks << 3; uStack_b0 = uStack_b0 + 8) {
    bVar1 = (uStack_b0 >> 3 & 1) == 0;
    if (bVar1) {
      block = cipher_text[uStack_b0];
      prev_block_even[0] = cipher_text[uStack_b0 + 1];
      prev_block_even[1] = cipher_text[uStack_b0 + 2];
      prev_block_even[2] = cipher_text[uStack_b0 + 3];
      prev_block_even[3] = cipher_text[uStack_b0 + 4];
      prev_block_even[4] = cipher_text[uStack_b0 + 5];
      prev_block_even[5] = cipher_text[uStack_b0 + 6];
      prev_block_even[6] = cipher_text[uStack_b0 + 7];
    }
    else {
      prev_block_even[7] = cipher_text[uStack_b0];
      prev_block_odd[0] = cipher_text[uStack_b0 + 1];
      prev_block_odd[1] = cipher_text[uStack_b0 + 2];
      prev_block_odd[2] = cipher_text[uStack_b0 + 3];
      prev_block_odd[3] = cipher_text[uStack_b0 + 4];
      prev_block_odd[4] = cipher_text[uStack_b0 + 5];
      prev_block_odd[5] = cipher_text[uStack_b0 + 6];
      prev_block_odd[6] = cipher_text[uStack_b0 + 7];
    }
    threefishDecryptBlockWords(key,cipher_text + uStack_b0,cipher_text + uStack_b0);
    if (uStack_b0 == 0) {
      *cipher_text = *iv ^ *cipher_text;
      cipher_text[1] = iv[1] ^ cipher_text[1];
      cipher_text[2] = iv[2] ^ cipher_text[2];
      cipher_text[3] = iv[3] ^ cipher_text[3];
      cipher_text[4] = iv[4] ^ cipher_text[4];
      cipher_text[5] = iv[5] ^ cipher_text[5];
      cipher_text[6] = iv[6] ^ cipher_text[6];
      cipher_text[7] = iv[7] ^ cipher_text[7];
    }
    else if (bVar1) {
      cipher_text[uStack_b0] = prev_block_even[7] ^ cipher_text[uStack_b0];
      cipher_text[uStack_b0 + 1] = prev_block_odd[0] ^ cipher_text[uStack_b0 + 1];
      cipher_text[uStack_b0 + 2] = prev_block_odd[1] ^ cipher_text[uStack_b0 + 2];
      cipher_text[uStack_b0 + 3] = prev_block_odd[2] ^ cipher_text[uStack_b0 + 3];
      cipher_text[uStack_b0 + 4] = prev_block_odd[3] ^ cipher_text[uStack_b0 + 4];
      cipher_text[uStack_b0 + 5] = prev_block_odd[4] ^ cipher_text[uStack_b0 + 5];
      cipher_text[uStack_b0 + 6] = prev_block_odd[5] ^ cipher_text[uStack_b0 + 6];
      cipher_text[uStack_b0 + 7] = prev_block_odd[6] ^ cipher_text[uStack_b0 + 7];
    }
    else {
      cipher_text[uStack_b0] = block ^ cipher_text[uStack_b0];
      cipher_text[uStack_b0 + 1] = prev_block_even[0] ^ cipher_text[uStack_b0 + 1];
      cipher_text[uStack_b0 + 2] = prev_block_even[1] ^ cipher_text[uStack_b0 + 2];
      cipher_text[uStack_b0 + 3] = prev_block_even[2] ^ cipher_text[uStack_b0 + 3];
      cipher_text[uStack_b0 + 4] = prev_block_even[3] ^ cipher_text[uStack_b0 + 4];
      cipher_text[uStack_b0 + 5] = prev_block_even[4] ^ cipher_text[uStack_b0 + 5];
      cipher_text[uStack_b0 + 6] = prev_block_even[5] ^ cipher_text[uStack_b0 + 6];
      cipher_text[uStack_b0 + 7] = prev_block_even[6] ^ cipher_text[uStack_b0 + 7];
    }
  }
  return;
}

Assistant:

void cbc512Decrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* cipher_text,
                   const uint64_t num_blocks)
{
    pd3("cbc512Decrypt()\n");
    uint64_t prev_block_odd[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text 
    uint64_t prev_block_even[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text
    
    pd3("decrypting %lu blocks\n", num_blocks);
    //pBuff(32, (uint8_t*)iv);

    for(uint64_t block=0; block<(num_blocks*SECURE_SLICE); block+=SECURE_SLICE) //run each block through the cipher (in decrypt mode)
    {
        bool even = ((block/SECURE_SLICE)%2 == 0) ? true : false;

        if(even)
        {
            //save the previous cipher text block if it is even 
            prev_block_even[0] = cipher_text[block];
            prev_block_even[1] = cipher_text[block+1];
            prev_block_even[2] = cipher_text[block+2];
            prev_block_even[3] = cipher_text[block+3];
            prev_block_even[4] = cipher_text[block+4];
            prev_block_even[5] = cipher_text[block+5];
            prev_block_even[6] = cipher_text[block+6];
            prev_block_even[7] = cipher_text[block+7];
        }
	else
        {
            //save the previous cipher text block if it is odd
            prev_block_odd[0] = cipher_text[block];
            prev_block_odd[1] = cipher_text[block+1];
            prev_block_odd[2] = cipher_text[block+2];
            prev_block_odd[3] = cipher_text[block+3];
            prev_block_odd[4] = cipher_text[block+4];
            prev_block_odd[5] = cipher_text[block+5];
            prev_block_odd[6] = cipher_text[block+6];
            prev_block_odd[7] = cipher_text[block+7];
        }

        //Run the block through the cipher
        threefishDecryptBlockWords(key, &cipher_text[block], &cipher_text[block]);
        if(block == 0) //xor the first block with the initialization vector
        {
            cipher_text[0] ^= iv[0]; cipher_text[1] ^= iv[1];
            cipher_text[2] ^= iv[2]; cipher_text[3] ^= iv[3];
            cipher_text[4] ^= iv[4]; cipher_text[5] ^= iv[5];
            cipher_text[6] ^= iv[6]; cipher_text[7] ^= iv[7];
        }
        else //xor the current block with the previous block of cipher text
        {
            if(even)
            {
                cipher_text[block] ^= prev_block_odd[0];
                cipher_text[block+1] ^= prev_block_odd[1];
                cipher_text[block+2] ^= prev_block_odd[2];
                cipher_text[block+3] ^= prev_block_odd[3];
                cipher_text[block+4] ^= prev_block_odd[4];
                cipher_text[block+5] ^= prev_block_odd[5];
                cipher_text[block+6] ^= prev_block_odd[6];
                cipher_text[block+7] ^= prev_block_odd[7];
            }
            else
            {
                cipher_text[block] ^= prev_block_even[0];
                cipher_text[block+1] ^= prev_block_even[1];
                cipher_text[block+2] ^= prev_block_even[2];
                cipher_text[block+3] ^= prev_block_even[3];
                cipher_text[block+4] ^= prev_block_even[4];
                cipher_text[block+5] ^= prev_block_even[5];
                cipher_text[block+6] ^= prev_block_even[6];
                cipher_text[block+7] ^= prev_block_even[7];
            }
        }
    }
}